

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O0

int jsfdigit(uint a,uint b)

{
  int u;
  uint b_local;
  uint a_local;
  int local_4;
  
  local_4 = 2 - (a & 3);
  if (local_4 == 2) {
    local_4 = 0;
  }
  else if ((((a & 7) == 3) || ((a & 7) == 5)) && ((b & 3) == 2)) {
    local_4 = -local_4;
  }
  return local_4;
}

Assistant:

static int
jsfdigit(unsigned int a, unsigned int b)
{
	int u = 2 - (a & 0x03);
	if (u == 2)
		return 0;
	if ( ((a & 0x07) == 3 || (a & 0x07) == 5) && (b & 0x03) == 2 )
		return -u;
	return u;
}